

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O2

unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
__thiscall
duckdb::ExtensionTypeInfo::Deserialize(ExtensionTypeInfo *this,Deserializer *deserializer)

{
  pointer pLVar1;
  pointer pEVar2;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_48;
  
  pLVar1 = (pointer)operator_new(0x50);
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&pLVar1->value + 0x10))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)((long)&pLVar1->value + 0x18) = 0;
  ((Val *)((long)&pLVar1->value + 0x20))->bigint = 0;
  *(undefined8 *)((long)&pLVar1->value + 0x28) = 0;
  *(undefined8 *)
   &((shared_ptr<duckdb::ExtraValueInfo,_true> *)((long)&pLVar1->value + 0x30))->internal = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&pLVar1->value + 0x38))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&pLVar1->value = 0;
  *(undefined8 *)&((shared_ptr<duckdb::ExtraTypeInfo,_true> *)((long)&pLVar1->value + 8))->internal
       = 0;
  *(size_type **)((long)&pLVar1->value + 0x18) = (size_type *)((long)&pLVar1->label + 8);
  ((Val *)((long)&pLVar1->value + 0x20))->bigint = 1;
  *(undefined8 *)((long)&pLVar1->value + 0x28) = 0;
  *(undefined8 *)
   &((shared_ptr<duckdb::ExtraValueInfo,_true> *)((long)&pLVar1->value + 0x30))->internal = 0;
  *(undefined4 *)
   &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&pLVar1->value + 0x38))->_M_pi =
       0x3f800000;
  (pLVar1->label)._M_dataplus = (pointer)0x0;
  *(size_type *)((long)&pLVar1->label + 8) = 0;
  (this->modifiers).
  super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
  super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>.
  _M_impl.super__Vector_impl_data._M_start = pLVar1;
  pEVar2 = unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
                         *)this);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalTypeModifier,true>>
            (deserializer,100,"modifiers",&pEVar2->modifiers);
  pEVar2 = unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
                         *)this);
  local_48._M_buckets = &local_48._M_single_bucket;
  local_48._M_bucket_count = 1;
  local_48._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_48._M_element_count = 0;
  local_48._M_rehash_policy._M_max_load_factor = 1.0;
  local_48._M_rehash_policy._4_4_ = 0;
  local_48._M_rehash_policy._M_next_resize = 0;
  local_48._M_single_bucket = (__node_base_ptr)0x0;
  Deserializer::
  ReadPropertyWithExplicitDefault<std::unordered_map<std::__cxx11::string,duckdb::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
            (deserializer,0x65,"properties",
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
              *)&pEVar2->properties,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
              *)&local_48);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_48);
  return (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
         (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
         this;
}

Assistant:

unique_ptr<ExtensionTypeInfo> ExtensionTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ExtensionTypeInfo>(new ExtensionTypeInfo());
	deserializer.ReadPropertyWithDefault<vector<LogicalTypeModifier>>(100, "modifiers", result->modifiers);
	deserializer.ReadPropertyWithExplicitDefault<unordered_map<string, Value>>(101, "properties", result->properties, unordered_map<string, Value>());
	return result;
}